

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_INCDECP_r(DisasContext_conflict1 *s,arg_incdec_pred *a)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  undefined1 extraout_AL;
  TCGv_i64 ret;
  TCGTemp *a3;
  uintptr_t o;
  uintptr_t o_1;
  TCGv_i64 val;
  
  s_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    ret = cpu_reg_aarch64(s,a->rd);
    a3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    val = (TCGv_i64)((long)a3 - (long)s_00);
    do_cntp(s,val,a->esz,a->pg,a->pg);
    if (a->d == 0) {
      tcg_gen_op3_aarch64(s_00,INDEX_op_add_i64,(TCGArg)(ret + (long)s_00),
                          (TCGArg)(ret + (long)s_00),(TCGArg)a3);
    }
    else {
      tcg_gen_sub_i64(s_00,ret,ret,val);
    }
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(val + (long)s_00));
    return (_Bool)extraout_AL;
  }
  return _Var1;
}

Assistant:

static bool trans_INCDECP_r(DisasContext *s, arg_incdec_pred *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 reg = cpu_reg(s, a->rd);
        TCGv_i64 val = tcg_temp_new_i64(tcg_ctx);

        do_cntp(s, val, a->esz, a->pg, a->pg);
        if (a->d) {
            tcg_gen_sub_i64(tcg_ctx, reg, reg, val);
        } else {
            tcg_gen_add_i64(tcg_ctx, reg, reg, val);
        }
        tcg_temp_free_i64(tcg_ctx, val);
    }
    return true;
}